

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_defer_io_task(intptr_t uuid,fio_defer_iotask_args_s args)

{
  undefined8 *puVar1;
  int *piVar2;
  fio_defer_task_s *pfVar3;
  fio_defer_task_s local_40;
  fio_defer_task_s local_28;
  
  if (args.task == (_func_void_intptr_t_fio_protocol_s_ptr_void_ptr *)0x0) {
    if (args.fallback == (_func_void_intptr_t_void_ptr *)0x0) {
      return;
    }
    pfVar3 = &local_28;
    local_28.func = (_func_void_void_ptr_void_ptr *)args.fallback;
    local_28.arg1 = (void *)uuid;
  }
  else {
    puVar1 = (undefined8 *)fio_malloc(0x20);
    if (puVar1 == (undefined8 *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3481"
                      );
      }
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
    puVar1[2] = args.udata;
    puVar1[3] = args.fallback;
    *puVar1 = args._0_8_;
    puVar1[1] = args.task;
    pfVar3 = &local_40;
    local_40.func = fio_io_task_perform;
    local_40.arg1 = (void *)uuid;
    args.udata = puVar1;
  }
  pfVar3->arg2 = args.udata;
  fio_defer_push_task_fn(*pfVar3,&task_queue_normal);
  return;
}

Assistant:

void fio_defer_io_task FIO_IGNORE_MACRO(intptr_t uuid,
                                        fio_defer_iotask_args_s args) {
  if (!args.task) {
    if (args.fallback)
      fio_defer_push_task((void (*)(void *, void *))args.fallback, (void *)uuid,
                          args.udata);
    return;
  }
  fio_defer_iotask_args_s *cpy = fio_malloc(sizeof(*cpy));
  FIO_ASSERT_ALLOC(cpy);
  *cpy = args;
  fio_defer_push_task(fio_io_task_perform, (void *)uuid, cpy);
}